

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

void mbedtls_mpi_free(mbedtls_mpi *X)

{
  mbedtls_mpi *X_local;
  
  if (X != (mbedtls_mpi *)0x0) {
    if (X->p != (mbedtls_mpi_uint *)0x0) {
      mbedtls_mpi_zeroize(X->p,X->n);
      free(X->p);
    }
    X->s = 1;
    X->n = 0;
    X->p = (mbedtls_mpi_uint *)0x0;
  }
  return;
}

Assistant:

void mbedtls_mpi_free( mbedtls_mpi *X )
{
    if( X == NULL )
        return;

    if( X->p != NULL )
    {
        mbedtls_mpi_zeroize( X->p, X->n );
        mbedtls_free( X->p );
    }

    X->s = 1;
    X->n = 0;
    X->p = NULL;
}